

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void wc_relative_cb(Fl_Light_Button *i,void *v)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  Fl_Widget_Class_Type *t;
  Fl_Type *pFVar4;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"widget_class");
    pp_Var1 = (i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget;
    if (iVar2 == 0) {
      (*pp_Var1[5])(i);
      Fl_Button::value(&i->super_Fl_Button,
                       (int)*(char *)((long)&current_widget[1].super_Fl_Type.prev + 1));
      return;
    }
    (*pp_Var1[6])(i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar3 = true;
    pFVar4 = Fl_Type::first;
LAB_00183ee4:
    do {
      if (pFVar4->selected != '\0') {
        iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[5])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"widget_class");
        if (iVar2 == 0) {
          *(char *)((long)&pFVar4[2].prev + 1) = (i->super_Fl_Button).value_;
          pFVar4 = pFVar4->next;
          bVar3 = false;
          if (pFVar4 == (Fl_Type *)0x0) goto LAB_00183f6d;
          goto LAB_00183ee4;
        }
      }
      pFVar4 = pFVar4->next;
    } while (pFVar4 != (Fl_Type *)0x0);
    if (!bVar3) {
LAB_00183f6d:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void wc_relative_cb(Fl_Light_Button *i, void *v) {
  if (v == LOAD) {
    if (!strcmp(current_widget->type_name(), "widget_class")) {
      i->show();
      i->value(((Fl_Widget_Class_Type *)current_widget)->wc_relative);
    } else {
      i->hide();
    }
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && !strcmp(current_widget->type_name(), "widget_class")) {
        Fl_Widget_Class_Type *t = (Fl_Widget_Class_Type *)o;
        t->wc_relative = i->value();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}